

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

container_t * convert_run_to_efficient_container(run_container_t *c,uint8_t *typecode_after)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  rle16_t *prVar4;
  uint16_t *puVar5;
  int size;
  array_container_t *paVar6;
  ulong uVar7;
  uint uVar8;
  uint8_t uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint16_t uVar14;
  byte bVar15;
  uint uVar16;
  
  iVar3 = c->n_runs;
  size = run_container_cardinality(c);
  iVar11 = 0x1ffe;
  if (size * 2 < 0x1ffe) {
    iVar11 = size * 2;
  }
  uVar9 = '\x03';
  paVar6 = (array_container_t *)c;
  if (iVar11 < iVar3 * 4) {
    if (size < 0x1001) {
      paVar6 = array_container_create_given_capacity(size);
      paVar6->cardinality = 0;
      iVar3 = c->n_runs;
      uVar9 = '\x02';
      if (0 < (long)iVar3) {
        prVar4 = c->runs;
        puVar5 = paVar6->array;
        lVar10 = 0;
        lVar12 = 0;
        do {
          uVar14 = prVar4[lVar10].value;
          uVar1 = prVar4[lVar10].length;
          iVar11 = (int)lVar12;
          lVar12 = (long)iVar11;
          uVar13 = 0;
          do {
            puVar5[lVar12] = uVar14;
            lVar12 = lVar12 + 1;
            uVar13 = uVar13 - 1;
            uVar14 = uVar14 + 1;
          } while (~(uint)uVar1 != uVar13);
          lVar10 = lVar10 + 1;
        } while (lVar10 != iVar3);
        paVar6->cardinality = iVar11 - uVar13;
      }
    }
    else {
      paVar6 = (array_container_t *)bitset_container_create();
      iVar3 = c->n_runs;
      if (0 < (long)iVar3) {
        prVar4 = c->runs;
        puVar5 = paVar6->array;
        lVar10 = 0;
        do {
          uVar1 = prVar4[lVar10].value;
          uVar2 = prVar4[lVar10].length;
          if ((uint)uVar2 + (uint)uVar1 + 1 != (uint)uVar1) {
            uVar16 = (uint)uVar2 + (uint)uVar1;
            uVar8 = (uint)(uVar1 >> 6);
            uVar7 = -1L << ((byte)uVar1 & 0x3f);
            uVar13 = uVar16 >> 6;
            bVar15 = (byte)uVar16;
            if (uVar13 - uVar8 == 0) {
              bVar15 = ~bVar15;
              uVar7 = (uVar7 << (bVar15 & 0x3f)) >> (bVar15 & 0x3f);
              uVar13 = uVar8;
            }
            else {
              *(ulong *)(puVar5 + (ulong)uVar8 * 4) = *(ulong *)(puVar5 + (ulong)uVar8 * 4) | uVar7;
              if (uVar8 + 1 < uVar13) {
                memset(puVar5 + (ulong)(uVar1 >> 6) * 4 + 4,0xff,
                       (ulong)((uVar13 - uVar8) - 2) * 8 + 8);
              }
              uVar7 = 0xffffffffffffffff >> (~bVar15 & 0x3f);
            }
            *(ulong *)(puVar5 + (ulong)uVar13 * 4) = *(ulong *)(puVar5 + (ulong)uVar13 * 4) | uVar7;
          }
          lVar10 = lVar10 + 1;
        } while (iVar3 != lVar10);
      }
      paVar6->cardinality = size;
      uVar9 = '\x01';
    }
  }
  *typecode_after = uVar9;
  return paVar6;
}

Assistant:

container_t *convert_run_to_efficient_container(run_container_t *c,
                                                uint8_t *typecode_after) {
    int32_t size_as_run_container =
        run_container_serialized_size_in_bytes(c->n_runs);

    int32_t size_as_bitset_container =
        bitset_container_serialized_size_in_bytes();
    int32_t card = run_container_cardinality(c);
    int32_t size_as_array_container =
        array_container_serialized_size_in_bytes(card);

    int32_t min_size_non_run =
        size_as_bitset_container < size_as_array_container
            ? size_as_bitset_container
            : size_as_array_container;
    if (size_as_run_container <= min_size_non_run) {  // no conversion
        *typecode_after = RUN_CONTAINER_TYPE;
        return c;
    }
    if (card <= DEFAULT_MAX_SIZE) {
        // to array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
            int run_start = c->runs[rlepos].value;
            int run_end = run_start + c->runs[rlepos].length;

            for (int run_value = run_start; run_value <= run_end; ++run_value) {
                answer->array[answer->cardinality++] = (uint16_t)run_value;
            }
        }
        *typecode_after = ARRAY_CONTAINER_TYPE;
        return answer;
    }

    // else to bitset
    bitset_container_t *answer = bitset_container_create();

    for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
        int start = c->runs[rlepos].value;
        int end = start + c->runs[rlepos].length;
        bitset_set_range(answer->words, start, end + 1);
    }
    answer->cardinality = card;
    *typecode_after = BITSET_CONTAINER_TYPE;
    return answer;
}